

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Semaphore>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  RefData<vk::Handle<(vk::HandleType)4>_> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  Unique<vk::Handle<(vk::HandleType)4>_> *this_00;
  reference this_01;
  allocator<char> local_2a1;
  string local_2a0;
  undefined1 local_279;
  Move<vk::Handle<(vk::HandleType)4>_> local_278;
  RefData<vk::Handle<(vk::HandleType)4>_> local_258;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> local_238;
  uint local_224;
  char *pcStack_220;
  deUint32 ndx;
  MessageBuilder local_218;
  undefined4 local_98;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_> local_81;
  undefined1 local_80 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  objects;
  undefined1 local_60 [7];
  Resources res;
  Environment env;
  deUint32 numObjects;
  Context *context_local;
  TestStatus *pTStack_10;
  Parameters params_local;
  
  context_local._4_4_ = params.flags;
  pTStack_10 = __return_storage_ptr__;
  env._52_4_ = Semaphore::getMaxConcurrent(context,(Parameters *)((long)&context_local + 4));
  Environment::Environment((Environment *)local_60,context,env._52_4_);
  Semaphore::Resources::Resources
            ((Resources *)
             ((long)&objects.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),(Environment *)local_60
             ,(Parameters *)((long)&context_local + 4));
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>::allocator
            (&local_81);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
            *)local_80,__n,&local_81);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>::
  ~allocator(&local_81);
  local_98 = 0x400;
  pTVar1 = Context::getTestContext(context);
  this = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_218,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_218,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13b8ff9);
  pcStack_220 = ::vk::getTypeName<vk::Handle<(vk::HandleType)4>>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffde0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13837bb);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_218);
  for (local_224 = 0; local_224 < (uint)env._52_4_; local_224 = local_224 + 1) {
    this_00 = (Unique<vk::Handle<(vk::HandleType)4>_> *)operator_new(0x20);
    local_279 = 1;
    Semaphore::create(&local_278,(Environment *)local_60,
                      (Resources *)
                      ((long)&objects.
                              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                      (Parameters *)((long)&context_local + 4));
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_258,(Move *)&local_278);
    data.deleter.m_deviceIface = local_258.deleter.m_deviceIface;
    data.object.m_internal = local_258.object.m_internal;
    data.deleter.m_device = local_258.deleter.m_device;
    data.deleter.m_allocator = local_258.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique(this_00,data);
    local_279 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::SharedPtr
              (&local_238,this_00);
    this_01 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                            *)local_80,(ulong)local_224);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator=
              (this_01,&local_238);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::~SharedPtr(&local_238);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move(&local_278);
    if ((local_224 != 0) && ((local_224 & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext(context);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
           *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Ok",&local_2a1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
             *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}